

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t *p_image,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  char *fmt;
  ulong uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  opj_image_comp_t *poVar10;
  
  if (p_image->numcomps != 0) {
    poVar10 = p_image->comps;
    uVar4 = 0;
    do {
      lVar3 = (long)(int)poVar10->dx;
      if (lVar3 == 0) {
LAB_00111f2f:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                      ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
      }
      OVar6 = (OPJ_UINT32)(((int)p_image->x0 + lVar3 + -1) / lVar3);
      poVar10->x0 = OVar6;
      lVar8 = (long)(int)poVar10->dy;
      if (lVar8 == 0) goto LAB_00111f2f;
      OVar5 = (OPJ_UINT32)(((int)p_image->y0 + lVar8 + -1) / lVar8);
      poVar10->y0 = OVar5;
      bVar2 = (byte)poVar10->factor;
      lVar9 = 1L << (bVar2 & 0x3f);
      uVar7 = (int)(lVar9 + (int)(((int)p_image->x1 + lVar3 + -1) / lVar3) + -1 >> (bVar2 & 0x3f)) -
              (int)((int)OVar6 + lVar9 + -1 >> (bVar2 & 0x3f));
      if ((int)uVar7 < 0) {
        fmt = "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n";
LAB_00111eff:
        bVar1 = false;
        opj_event_msg(p_manager,1,fmt,uVar4,(ulong)uVar7);
      }
      else {
        OVar6 = p_image->y1;
        poVar10->w = uVar7;
        uVar7 = (int)((int)(((int)OVar6 + lVar8 + -1) / lVar8) + lVar9 + -1 >> (bVar2 & 0x3f)) -
                (int)((int)OVar5 + lVar9 + -1 >> (bVar2 & 0x3f));
        if ((int)uVar7 < 0) {
          fmt = "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n";
          goto LAB_00111eff;
        }
        poVar10->h = uVar7;
        poVar10 = poVar10 + 1;
        bVar1 = true;
      }
      if (!bVar1) {
        return 0;
      }
      uVar7 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar7;
    } while (uVar7 < p_image->numcomps);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t* p_image,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 it_comp;
    OPJ_INT32 l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_img_comp = p_image->comps;
    for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
        OPJ_INT32 l_h, l_w;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_w = opj_int_ceildivpow2(l_comp_x1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0, (OPJ_INT32)l_img_comp->factor);
        if (l_w < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
                          it_comp, l_w);
            return OPJ_FALSE;
        }
        l_img_comp->w = (OPJ_UINT32)l_w;

        l_h = opj_int_ceildivpow2(l_comp_y1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0, (OPJ_INT32)l_img_comp->factor);
        if (l_h < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
                          it_comp, l_h);
            return OPJ_FALSE;
        }
        l_img_comp->h = (OPJ_UINT32)l_h;

        l_img_comp++;
    }

    return OPJ_TRUE;
}